

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::makewt(int nw,int *ip,double *w)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  *ip = nw;
  ip[1] = 1;
  if (2 < nw) {
    uVar6 = (uint)nw >> 1;
    dVar10 = 0.7853981633974483 / (double)uVar6;
    dVar8 = cos((double)uVar6 * dVar10);
    *w = 1.0;
    w[1] = dVar8;
    if (uVar6 == 4) {
      dVar9 = cos(dVar10 + dVar10);
      w[2] = dVar9;
      dVar10 = sin(dVar10 + dVar10);
      w[3] = dVar10;
    }
    else if (9 < (uint)nw) {
      makeipt(nw,ip);
      dVar9 = cos(dVar10 + dVar10);
      w[2] = 0.5 / dVar9;
      dVar9 = cos(dVar10 * 6.0);
      w[3] = 0.5 / dVar9;
      uVar5 = 4;
      do {
        dVar9 = dVar10 * (double)(int)uVar5;
        dVar11 = cos(dVar9);
        w[uVar5] = dVar11;
        dVar9 = sin(dVar9);
        w[uVar5 + 1] = dVar9;
        dVar9 = (double)(int)uVar5 * dVar10 * 3.0;
        dVar11 = cos(dVar9);
        w[uVar5 + 2] = dVar11;
        dVar9 = sin(dVar9);
        w[uVar5 + 3] = -dVar9;
        uVar5 = uVar5 + 4;
      } while (uVar5 < uVar6);
    }
    auVar2 = _DAT_0012c5d0;
    if (5 < (uint)nw) {
      uVar5 = 0;
      do {
        uVar3 = (ulong)(uVar6 + (int)uVar5);
        uVar7 = uVar6 >> 1;
        w[uVar3] = 1.0;
        w[uVar3 + 1] = dVar8;
        if (uVar7 == 4) {
          dVar10 = (w + uVar5 + 4)[1];
          w[uVar3 + 2] = w[uVar5 + 4];
          (w + uVar3 + 2)[1] = dVar10;
        }
        else if (9 < uVar6) {
          auVar12._8_4_ = SUB84(w[uVar5 + 6],0);
          auVar12._0_8_ = w[uVar5 + 4];
          auVar12._12_4_ = (int)((ulong)w[uVar5 + 6] >> 0x20);
          auVar12 = divpd(auVar2,auVar12);
          *(undefined1 (*) [16])(w + uVar3 + 2) = auVar12;
          pdVar4 = w + uVar5 + 10;
          uVar5 = 4;
          do {
            dVar10 = pdVar4[-1];
            dVar9 = *pdVar4;
            dVar11 = pdVar4[1];
            w[uVar3 + uVar5] = pdVar4[-2];
            (w + uVar3 + uVar5)[1] = dVar10;
            w[uVar3 + uVar5 + 2] = dVar9;
            (w + uVar3 + uVar5 + 2)[1] = dVar11;
            uVar5 = uVar5 + 4;
            pdVar4 = pdVar4 + 8;
          } while (uVar5 < uVar7);
        }
        bVar1 = 5 < uVar6;
        uVar5 = uVar3;
        uVar6 = uVar7;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void makewt(int nw, int *ip, double *w) {
#if 0
  void makeipt(int nw, int *ip);
#endif
  int j, nwh, nw0, nw1;
  double delta, wn4r, wk1r, wk1i, wk3r, wk3i;

  ip[0] = nw;
  ip[1] = 1;
  if (nw > 2) {
    nwh = nw >> 1;
    delta = atan(1.0) / nwh;
    wn4r = cos(delta * nwh);
    w[0] = 1;
    w[1] = wn4r;
    if (nwh == 4) {
      w[2] = cos(delta * 2);
      w[3] = sin(delta * 2);
    } else if (nwh > 4) {
      makeipt(nw, ip);
      w[2] = 0.5 / cos(delta * 2);
      w[3] = 0.5 / cos(delta * 6);
      for (j = 4; j < nwh; j += 4) {
        w[j] = cos(delta * j);
        w[j + 1] = sin(delta * j);
        w[j + 2] = cos(3 * delta * j);
        w[j + 3] = -sin(3 * delta * j);
      }
    }
    nw0 = 0;
    while (nwh > 2) {
      nw1 = nw0 + nwh;
      nwh >>= 1;
      w[nw1] = 1;
      w[nw1 + 1] = wn4r;
      if (nwh == 4) {
        wk1r = w[nw0 + 4];
        wk1i = w[nw0 + 5];
        w[nw1 + 2] = wk1r;
        w[nw1 + 3] = wk1i;
      } else if (nwh > 4) {
        wk1r = w[nw0 + 4];
        wk3r = w[nw0 + 6];
        w[nw1 + 2] = 0.5 / wk1r;
        w[nw1 + 3] = 0.5 / wk3r;
        for (j = 4; j < nwh; j += 4) {
          wk1r = w[nw0 + 2 * j];
          wk1i = w[nw0 + 2 * j + 1];
          wk3r = w[nw0 + 2 * j + 2];
          wk3i = w[nw0 + 2 * j + 3];
          w[nw1 + j] = wk1r;
          w[nw1 + j + 1] = wk1i;
          w[nw1 + j + 2] = wk3r;
          w[nw1 + j + 3] = wk3i;
        }
      }
      nw0 = nw1;
    }
  }
}